

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_pool.hpp
# Opt level: O3

packet_ptr __thiscall libtorrent::aux::packet_slab::alloc(packet_slab *this)

{
  ushort uVar1;
  long lVar2;
  void *__ptr_00;
  undefined8 *puVar3;
  ushort *in_RSI;
  pointer *__ptr;
  
  lVar2 = *(long *)(in_RSI + 0xc);
  if (*(long *)(in_RSI + 8) == lVar2) {
    uVar1 = *in_RSI;
    puVar3 = (undefined8 *)malloc((ulong)uVar1 + 0x10);
    if (puVar3 == (undefined8 *)0x0) {
      throw_ex<std::bad_alloc>();
    }
    *puVar3 = 0;
    puVar3[1] = 0;
    *(ushort *)(puVar3 + 1) = uVar1;
    *(undefined8 **)this = puVar3;
  }
  else {
    *(undefined8 *)this = *(undefined8 *)(lVar2 + -8);
    *(undefined8 *)(lVar2 + -8) = 0;
    lVar2 = *(long *)(in_RSI + 0xc);
    puVar3 = (undefined8 *)(lVar2 + -8);
    *(undefined8 **)(in_RSI + 0xc) = puVar3;
    __ptr_00 = *(void **)(lVar2 + -8);
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    *puVar3 = 0;
  }
  return (__uniq_ptr_data<libtorrent::aux::packet,_libtorrent::aux::packet_deleter,_true,_true>)
         (__uniq_ptr_data<libtorrent::aux::packet,_libtorrent::aux::packet_deleter,_true,_true>)this
  ;
}

Assistant:

packet_ptr alloc()
		{
			if (m_storage.empty()) return create_packet(allocate_size);
			auto ret = std::move(m_storage.back());
#ifdef TORRENT_ADDRESS_SANITIZER
			__asan_unpoison_memory_region(ret.get(), sizeof(packet) + std::size_t(allocate_size));
#endif
			m_storage.pop_back();
			return ret;
		}